

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void divide_subset_split<float,unsigned_long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double split_point,MissingAction missing_action,
               size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  int in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  long *in_stack_00000028;
  size_t *row_4;
  size_t *row_3;
  size_t *r_3;
  size_t *r_2;
  size_t *row_2;
  bool has_NAs;
  size_t *row_1;
  size_t *r_1;
  size_t *r;
  size_t *row;
  size_t *ptr_st;
  bool move_zeros;
  size_t temp;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  unsigned_long *in_stack_fffffffffffffe98;
  unsigned_long *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined1 uVar10;
  unsigned_long *in_stack_fffffffffffffeb0;
  long local_d8;
  long local_d0;
  long local_c8;
  ulong *local_c0;
  ulong *local_b8;
  ulong *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong local_50;
  long local_10;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    if (in_stack_00000010 == 0) {
      local_c8 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_c8 = in_RDX + 1;
      }
      *in_stack_00000028 = local_c8;
    }
    else {
      local_d0 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_d0 = in_RDX + 1;
      }
      *in_stack_00000018 = local_d0;
      local_d8 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_d8 = in_RDX + 1;
      }
      *in_stack_00000020 = local_d8;
    }
  }
  uVar1 = *(ulong *)(in_stack_00000008 + in_RCX * 8);
  uVar2 = *(ulong *)(in_stack_00000008 + 8 + in_RCX * 8);
  uVar7 = uVar2 - 1;
  uVar3 = *(ulong *)(in_R9 + uVar7 * 8);
  bVar9 = 0.0 <= in_XMM0_Qa;
  local_b8 = std::lower_bound<unsigned_long*,unsigned_long>
                       (in_stack_fffffffffffffeb0,
                        (unsigned_long *)
                        CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea0);
  local_10 = in_RSI;
  if ((bVar9) && ((unsigned_long *)(in_RDI + in_RSI * 8) < local_b8)) {
    local_10 = (long)local_b8 - in_RDI >> 3;
  }
  local_50 = uVar1;
  if (in_stack_00000010 == 0) {
    local_90 = local_b8;
    local_78 = local_b8;
    if (bVar9) {
LAB_005be805:
      while (local_78 != (ulong *)(in_RDI + in_RDX * 8 + 8)) {
        if (uVar2 <= local_50) {
          for (local_80 = local_78; local_80 <= (ulong *)(in_RDI + in_RDX * 8);
              local_80 = local_80 + 1) {
            uVar1 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_80;
            *local_80 = uVar1;
            local_10 = local_10 + 1;
          }
          break;
        }
        if (*(ulong *)(in_R9 + local_50 * 8) == *local_78) {
          if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
            uVar1 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_78;
            *local_78 = uVar1;
            local_10 = local_10 + 1;
          }
          if ((local_50 == uVar7) &&
             (local_88 = local_78, local_78 < (ulong *)(in_RDI + in_RDX * 8))) {
            while (local_88 = local_88 + 1, local_88 <= (ulong *)(in_RDI + in_RDX * 8)) {
              uVar1 = *(ulong *)(in_RDI + local_10 * 8);
              *(ulong *)(in_RDI + local_10 * 8) = *local_88;
              *local_88 = uVar1;
              local_10 = local_10 + 1;
            }
          }
          if ((local_78 != (ulong *)(in_RDI + in_RDX * 8)) && (local_50 != uVar7))
          goto LAB_005beadf;
          break;
        }
        if (*local_78 < *(ulong *)(in_R9 + local_50 * 8)) {
          while( true ) {
            bVar9 = false;
            if (local_78 <= (ulong *)(in_RDI + in_RDX * 8)) {
              bVar9 = *local_78 < *(ulong *)(in_R9 + local_50 * 8);
            }
            if (!bVar9) break;
            uVar1 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_78;
            *local_78 = uVar1;
            local_10 = local_10 + 1;
            local_78 = local_78 + 1;
          }
        }
        else {
          puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)puVar8 - in_R9 >> 3;
        }
      }
      goto LAB_005bef50;
    }
    while( true ) {
      bVar9 = false;
      if ((local_90 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != uVar2)) {
        bVar9 = *local_90 <= uVar3;
      }
      if (!bVar9) break;
      if (*(ulong *)(in_R9 + local_50 * 8) == *local_90) {
        if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
          uVar1 = *(ulong *)(in_RDI + local_10 * 8);
          *(ulong *)(in_RDI + local_10 * 8) = *local_90;
          *local_90 = uVar1;
          local_10 = local_10 + 1;
        }
        if ((local_90 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar7)) break;
        local_90 = local_90 + 1;
        puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                           (in_stack_fffffffffffffeb0,
                            (unsigned_long *)
                            CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)puVar8 - in_R9 >> 3;
      }
      else if (*local_90 < *(ulong *)(in_R9 + local_50 * 8)) {
        local_90 = std::lower_bound<unsigned_long*,unsigned_long>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
      }
      else {
        puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                           (in_stack_fffffffffffffeb0,
                            (unsigned_long *)
                            CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)puVar8 - in_R9 >> 3;
      }
    }
LAB_005bef50:
    *in_stack_00000028 = local_10;
  }
  else {
    bVar5 = false;
    local_a0 = local_b8;
    if (bVar9) {
LAB_005bef8e:
      while (local_a0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) {
        if (uVar2 <= local_50) {
          for (local_a8 = local_a0; local_a8 <= (ulong *)(in_RDI + in_RDX * 8);
              local_a8 = local_a8 + 1) {
            uVar4 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_a8;
            *local_a8 = uVar4;
            local_10 = local_10 + 1;
          }
          break;
        }
        if (*(ulong *)(in_R9 + local_50 * 8) == *local_a0) {
          uVar6 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          if ((uVar6 & 1) == 0) {
            if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
              uVar4 = *(ulong *)(in_RDI + local_10 * 8);
              *(ulong *)(in_RDI + local_10 * 8) = *local_a0;
              *local_a0 = uVar4;
              local_10 = local_10 + 1;
            }
          }
          else {
            bVar5 = true;
          }
          if ((local_50 == uVar7) &&
             (local_b0 = local_a0, local_a0 < (ulong *)(in_RDI + in_RDX * 8))) {
            while (local_b0 = local_b0 + 1, local_b0 <= (ulong *)(in_RDI + in_RDX * 8)) {
              uVar4 = *(ulong *)(in_RDI + local_10 * 8);
              *(ulong *)(in_RDI + local_10 * 8) = *local_b0;
              *local_b0 = uVar4;
              local_10 = local_10 + 1;
            }
          }
          if ((local_a0 != (ulong *)(in_RDI + in_RDX * 8)) && (local_50 != uVar7))
          goto LAB_005bf297;
          break;
        }
        if (*local_a0 < *(ulong *)(in_R9 + local_50 * 8)) {
          while( true ) {
            bVar9 = false;
            if (local_a0 <= (ulong *)(in_RDI + in_RDX * 8)) {
              bVar9 = *local_a0 < *(ulong *)(in_R9 + local_50 * 8);
            }
            if (!bVar9) break;
            uVar4 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_a0;
            *local_a0 = uVar4;
            local_10 = local_10 + 1;
            local_a0 = local_a0 + 1;
          }
        }
        else {
          puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)puVar8 - in_R9 >> 3;
        }
      }
      goto LAB_005bf73d;
    }
    while( true ) {
      bVar9 = false;
      if ((local_b8 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != uVar2)) {
        bVar9 = *local_b8 <= uVar3;
      }
      if (!bVar9) break;
      if (*(ulong *)(in_R9 + local_50 * 8) == *local_b8) {
        uVar6 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        if ((uVar6 & 1) != 0) {
          bVar5 = true;
        }
        uVar6 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        if (((uVar6 & 1) == 0) && ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa)) {
          uVar4 = *(ulong *)(in_RDI + local_10 * 8);
          *(ulong *)(in_RDI + local_10 * 8) = *local_b8;
          *local_b8 = uVar4;
          local_10 = local_10 + 1;
        }
        if ((local_b8 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar7)) break;
        local_b8 = local_b8 + 1;
        puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                           (in_stack_fffffffffffffeb0,
                            (unsigned_long *)
                            CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)puVar8 - in_R9 >> 3;
      }
      else if (*local_b8 < *(ulong *)(in_R9 + local_50 * 8)) {
        local_b8 = std::lower_bound<unsigned_long*,unsigned_long>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
      }
      else {
        in_stack_fffffffffffffeb0 =
             std::lower_bound<unsigned_long*,unsigned_long>
                       (in_stack_fffffffffffffeb0,
                        (unsigned_long *)
                        CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea0);
        local_50 = (long)in_stack_fffffffffffffeb0 - in_R9 >> 3;
      }
    }
LAB_005bf73d:
    *in_stack_00000018 = local_10;
    if (bVar5) {
      std::sort<unsigned_long*>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_c0 = (ulong *)(in_RDI + local_10 * 8);
      local_50 = uVar1;
      while( true ) {
        uVar10 = false;
        if ((local_c0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (uVar10 = false, local_50 != uVar2))
        {
          uVar10 = *local_c0 <= uVar3;
        }
        if ((bool)uVar10 == false) break;
        if (*(ulong *)(in_R9 + local_50 * 8) == *local_c0) {
          uVar6 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          if ((uVar6 & 1) != 0) {
            uVar1 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_c0;
            *local_c0 = uVar1;
            local_10 = local_10 + 1;
          }
          if ((local_c0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar7)) break;
          local_c0 = local_c0 + 1;
          in_stack_fffffffffffffea0 =
               std::lower_bound<unsigned_long*,unsigned_long>
                         (in_stack_fffffffffffffeb0,
                          (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                          in_stack_fffffffffffffea0);
          local_50 = (long)in_stack_fffffffffffffea0 - in_R9 >> 3;
        }
        else if (*local_c0 < *(ulong *)(in_R9 + local_50 * 8)) {
          local_c0 = std::lower_bound<unsigned_long*,unsigned_long>
                               (in_stack_fffffffffffffeb0,
                                (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                                in_stack_fffffffffffffea0);
        }
        else {
          puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)puVar8 - in_R9 >> 3;
        }
      }
    }
    *in_stack_00000020 = local_10;
  }
  return;
LAB_005bf297:
  local_a0 = local_a0 + 1;
  puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                     (in_stack_fffffffffffffeb0,
                      (unsigned_long *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)
                      ,in_stack_fffffffffffffea0);
  local_50 = (long)puVar8 - in_R9 >> 3;
  goto LAB_005bef8e;
LAB_005beadf:
  local_78 = local_78 + 1;
  puVar8 = std::lower_bound<unsigned_long*,unsigned_long>
                     (in_stack_fffffffffffffeb0,
                      (unsigned_long *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)
                      ,in_stack_fffffffffffffea0);
  local_50 = (long)puVar8 - in_R9 >> 3;
  goto LAB_005be805;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}